

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::End(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  int iVar6;
  float fVar7;
  
  pIVar3 = GImGui;
  if ((1 < (GImGui->CurrentWindowStack).Size) || (GImGui->FrameScopePushedImplicitWindow == false))
  {
    pIVar2 = GImGui->CurrentWindow;
    if ((pIVar2->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
      EndColumns();
    }
    PopClipRect();
    uVar5 = pIVar2->Flags;
    if ((uVar5 >> 0x18 & 1) == 0) {
      LogFinish();
      uVar5 = pIVar2->Flags;
    }
    iVar1 = (pIVar3->CurrentWindowStack).Size;
    iVar6 = iVar1 + -1;
    (pIVar3->CurrentWindowStack).Size = iVar6;
    if ((uVar5 >> 0x1a & 1) != 0) {
      (pIVar3->BeginPopupStack).Size = (pIVar3->BeginPopupStack).Size + -1;
    }
    pIVar4 = GImGui;
    if (iVar6 == 0) {
      GImGui->CurrentWindow = (ImGuiWindow *)0x0;
    }
    else {
      pIVar2 = (pIVar3->CurrentWindowStack).Data[(long)iVar1 + -2];
      GImGui->CurrentWindow = pIVar2;
      if (pIVar2 != (ImGuiWindow *)0x0) {
        fVar7 = pIVar4->FontBaseSize * pIVar2->FontWindowScale;
        (pIVar4->DrawListSharedData).FontSize = fVar7;
        pIVar4->FontSize = fVar7;
      }
    }
  }
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;

    if (g.CurrentWindowStack.Size <= 1 && g.FrameScopePushedImplicitWindow)
    {
        IM_ASSERT(g.CurrentWindowStack.Size > 1 && "Calling End() too many times!");
        return; // FIXME-ERRORHANDLING
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    ImGuiWindow* window = g.CurrentWindow;

    if (window->DC.ColumnsSet != NULL)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    CheckStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}